

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-bi.c
# Opt level: O1

void server_communicate(int descriptor,Arguments *args)

{
  int iVar1;
  Benchmarks bench;
  Benchmarks local_50;
  
  setup_benchmarks(&local_50);
  if (0 < args->count) {
    iVar1 = 0;
    do {
      local_50.single_start = now();
      eventfd_wait(descriptor,1);
      eventfd_notify(descriptor,2);
      benchmark(&local_50);
      iVar1 = iVar1 + 1;
    } while (iVar1 < args->count);
  }
  args->size = 1;
  evaluate(&local_50,args);
  return;
}

Assistant:

void server_communicate(int descriptor, struct Arguments* args) {
	struct Benchmarks bench;
	int message;

	setup_benchmarks(&bench);

	for (message = 0; message < args->count; ++message) {
		bench.single_start = now();

		eventfd_wait(descriptor, SERVER_TOKEN);
		eventfd_notify(descriptor, CLIENT_TOKEN);

		benchmark(&bench);
	}

	// The message size is always one (it's just a signal)
	args->size = 1;
	evaluate(&bench, args);
}